

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::setReadOnly(DOMNamedNodeMapImpl *this,bool readOnl,bool deep)

{
  XMLSize_t XVar1;
  DOMNode *pDVar2;
  long *plVar3;
  long lVar4;
  DOMNodeImpl *this_00;
  DOMException *this_01;
  undefined7 in_register_00000011;
  long lVar5;
  ulong uVar6;
  
  if ((int)CONCAT71(in_register_00000011,deep) != 0) {
    lVar5 = 0;
    do {
      if ((this->fBuckets[lVar5] != (DOMNodeVector *)0x0) &&
         (XVar1 = this->fBuckets[lVar5]->nextFreeSlot, XVar1 != 0)) {
        uVar6 = 0;
        do {
          if ((this->fBuckets[lVar5]->nextFreeSlot <= uVar6) ||
             (pDVar2 = this->fBuckets[lVar5]->data[uVar6], pDVar2 == (DOMNode *)0x0)) {
LAB_002707e8:
            this_01 = (DOMException *)__cxa_allocate_exception(0x28);
            DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
            __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
          }
          plVar3 = (long *)__dynamic_cast(pDVar2,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                          0xfffffffffffffffe);
          if (plVar3 == (long *)0x0) goto LAB_002707e8;
          lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3);
          if (lVar4 == 0) goto LAB_002707e8;
          this_00 = (DOMNodeImpl *)(**(code **)(*plVar3 + 0x10))(plVar3);
          DOMNodeImpl::setReadOnly(this_00,readOnl,true);
          uVar6 = uVar6 + 1;
        } while (XVar1 != uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xc1);
  }
  return;
}

Assistant:

void DOMNamedNodeMapImpl::setReadOnly(bool readOnl, bool deep)
{
    // this->fReadOnly=readOnl;
    if(deep) {
        for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
            if(fBuckets[index]==0)
                continue;
            XMLSize_t sz = fBuckets[index]->size();
            for (XMLSize_t i=0; i<sz; ++i)
                castToNodeImpl(fBuckets[index]->elementAt(i))->setReadOnly(readOnl, deep);
        }
    }
}